

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Definition_const*,std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Definition_const*,std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>,std::equal_to<slang::ast::Definition_const*>>,std::allocator<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>>>>
::
emplace<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>>
          (sherwood_v3_table<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Definition_const*,std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Definition_const*,std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>,std::equal_to<slang::ast::Definition_const*>>,std::allocator<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>>>>
           *this,pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>
                 *key)

{
  EntryPointer psVar1;
  EntryPointer psVar2;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>,_bool>
  pVar3;
  
  current_entry =
       (EntryPointer)
       (*(long *)this +
       ((ulong)((long)key->first * -0x61c8864680b583eb) >> ((byte)this[0x10] & 0x3f)) * 0x28);
  if (current_entry->distance_from_desired < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar2 = current_entry;
    do {
      if (key->first == (psVar2->field_1).value.first) {
        pVar3._8_8_ = 0;
        pVar3.first.current = psVar2;
        return pVar3;
      }
      current_entry = psVar2 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar2 + 1;
      psVar2 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar3 = emplace_new_key<std::pair<slang::ast::Definition_const*,std::vector<slang::syntax::BindDirectiveSyntax_const*,std::allocator<slang::syntax::BindDirectiveSyntax_const*>>>>
                    (this,distance_from_desired,current_entry,key);
  return pVar3;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }